

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_Question_load(HTS_Question *question,HTS_File *fp)

{
  HTS_Boolean HVar1;
  int iVar2;
  char *pcVar3;
  HTS_Question *question_00;
  long in_RSI;
  undefined8 *in_RDI;
  HTS_Pattern *last_pattern;
  HTS_Pattern *pattern;
  char buff [1024];
  HTS_Question *local_428;
  HTS_Question *in_stack_fffffffffffffbe0;
  size_t in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf0;
  HTS_File *in_stack_fffffffffffffbf8;
  HTS_Boolean local_1;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == 0)) {
    local_1 = '\0';
  }
  else {
    HTS_Question_clear(in_stack_fffffffffffffbe0);
    HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    if (HVar1 == '\0') {
      local_1 = '\0';
    }
    else {
      pcVar3 = HTS_strdup((char *)in_stack_fffffffffffffbe0);
      *in_RDI = pcVar3;
      HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      if (HVar1 == '\0') {
        HTS_Question_clear(in_stack_fffffffffffffbe0);
        local_1 = '\0';
      }
      else {
        local_428 = (HTS_Question *)0x0;
        iVar2 = strcmp(&stack0xfffffffffffffbe8,"{");
        if (iVar2 == 0) {
          do {
            HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
            if (HVar1 == '\0') {
              HTS_Question_clear(in_stack_fffffffffffffbe0);
              return '\0';
            }
            question_00 = (HTS_Question *)
                          HTS_calloc(in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0);
            if (in_RDI[1] == 0) {
              in_RDI[1] = question_00;
            }
            else {
              local_428->head = (HTS_Pattern *)question_00;
            }
            pcVar3 = HTS_strdup((char *)question_00);
            question_00->string = pcVar3;
            question_00->head = (_HTS_Pattern *)0x0;
            HVar1 = HTS_get_pattern_token(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
            if (HVar1 == '\0') {
              HTS_Question_clear(question_00);
              return '\0';
            }
            local_428 = question_00;
            iVar2 = strcmp(&stack0xfffffffffffffbe8,"}");
            in_stack_fffffffffffffbe0 = local_428;
          } while (iVar2 != 0);
        }
        local_1 = '\x01';
      }
    }
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_Question_load(HTS_Question * question, HTS_File * fp)
{
   char buff[HTS_MAXBUFLEN];
   HTS_Pattern *pattern, *last_pattern;

   if (question == NULL || fp == NULL)
      return FALSE;

   HTS_Question_clear(question);

   /* get question name */
   if (HTS_get_pattern_token(fp, buff) == FALSE)
      return FALSE;
   question->string = HTS_strdup(buff);

   /* get pattern list */
   if (HTS_get_pattern_token(fp, buff) == FALSE) {
      HTS_Question_clear(question);
      return FALSE;
   }

   last_pattern = NULL;
   if (strcmp(buff, "{") == 0) {
      while (1) {
         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            HTS_Question_clear(question);
            return FALSE;
         }
         pattern = (HTS_Pattern *) HTS_calloc(1, sizeof(HTS_Pattern));
         if (question->head != NULL)
            last_pattern->next = pattern;
         else                   /* first time */
            question->head = pattern;
         pattern->string = HTS_strdup(buff);
         pattern->next = NULL;
         if (HTS_get_pattern_token(fp, buff) == FALSE) {
            HTS_Question_clear(question);
            return FALSE;
         }
         if (!strcmp(buff, "}"))
            break;
         last_pattern = pattern;
      }
   }
   return TRUE;
}